

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_tet_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  REF_INT ntri;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_c4;
  long local_c0;
  REF_NODE local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  local_b8 = ref_grid->node;
  *allowed = 0;
  if (-1 < node1) {
    ref_cell = ref_grid->cell[8];
    pRVar1 = ref_cell->ref_adj;
    if ((node1 < pRVar1->nnode) && (lVar7 = (long)pRVar1->first[(uint)node1], lVar7 != -1)) {
      uVar5 = ref_cell_nodes(ref_cell,pRVar1->item[lVar7].ref,local_a8);
      lVar4 = local_c0;
      do {
        local_c0 = lVar7;
        if (uVar5 != 0) {
          pcVar10 = "nodes";
          uVar9 = 0x34d;
          local_c0 = lVar4;
LAB_001ebf9e:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,uVar9,"ref_collapse_edge_tet_quality",(ulong)uVar5,pcVar10);
          return uVar5;
        }
        uVar6 = (ulong)ref_cell->node_per;
        if ((long)uVar6 < 1) {
LAB_001ebff0:
          uVar5 = ref_node_tet_quality(local_b8,local_a8,&local_b0);
          if (uVar5 != 0) {
            pcVar10 = "qual";
            uVar9 = 0x356;
            goto LAB_001ebf9e;
          }
          if (local_b0 < ref_grid->adapt->collapse_quality_absolute) {
            return 0;
          }
          uVar5 = ref_cell_ntri_with_tet_nodes(ref_grid->cell[3],local_a8,&local_c4);
          if (uVar5 != 0) {
            pcVar10 = "count boundary triangles";
            uVar9 = 0x35b;
            goto LAB_001ebf9e;
          }
          if (1 < local_c4) {
            return 0;
          }
        }
        else {
          uVar8 = 0;
          bVar3 = false;
          do {
            if (local_a8[uVar8] == node0) {
              bVar3 = true;
            }
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
          if (!bVar3) {
            if (0 < ref_cell->node_per) {
              uVar8 = 0;
              do {
                if (local_a8[uVar8] == node1) {
                  local_a8[uVar8] = node0;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < uVar6);
            }
            goto LAB_001ebff0;
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        local_c0 = (long)pRVar2[(int)local_c0].next;
        if (local_c0 == -1) break;
        uVar5 = ref_cell_nodes(ref_cell,pRVar2[local_c0].ref,local_a8);
        lVar7 = local_c0;
        lVar4 = local_c0;
      } while( true );
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_tet_quality(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, ntri;
  REF_DBL quality;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, collapse_quality_absolute))
      return REF_SUCCESS;

    RSS(ref_cell_ntri_with_tet_nodes(ref_grid_tri(ref_grid), nodes, &ntri),
        "count boundary triangles");
    if (ntri > 1) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}